

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishString(HelicsPublication pub,char *str,HelicsError *err)

{
  Publication *this;
  HelicsPublication pvVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view val;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a844a;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a844c;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a844a:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a844c:
  if (pvVar1 != (HelicsPublication)0x0) {
    this = *(Publication **)((long)pvVar1 + 0x18);
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (str != (char *)0x0) {
      sVar2 = strlen(str);
      _Var3._M_p = str;
    }
    val._M_str = _Var3._M_p;
    val._M_len = sVar2;
    helics::Publication::publishString(this,val);
  }
  return;
}

Assistant:

void helicsPublicationPublishString(HelicsPublication pub, const char* str, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(AS_STRING_VIEW(str));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}